

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.h
# Opt level: O0

void __thiscall adios2::helper::DimsArray::DimsArray(DimsArray *this,DimsArray *d1)

{
  size_t count;
  const_iterator __result;
  CoreDims *in_RSI;
  CoreDims *in_RDI;
  CoreDims *__first;
  size_t **local_18;
  
  count = CoreDims::size(in_RSI);
  CoreDims::CoreDims(in_RDI,count,&in_RDI[1].DimCount);
  in_RDI[1].DimCount = 0;
  local_18 = &in_RDI[1].DimensSpan;
  __first = in_RDI + 0x11;
  do {
    *local_18 = (size_t *)0x0;
    local_18 = local_18 + 1;
  } while ((CoreDims *)local_18 != __first);
  __result = CoreDims::begin(in_RSI);
  CoreDims::end(in_RSI);
  std::copy<unsigned_long_const*,unsigned_long*>(&__first->DimCount,&in_RDI->DimCount,__result);
  return;
}

Assistant:

DimsArray(const DimsArray &d1) : CoreDims(d1.size(), &Dimensions[0])
    {
        std::copy(d1.begin(), d1.end(), &Dimensions[0]);
    }